

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::IsValidParamName(string *name)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RDI;
  size_type index;
  ulong local_18;
  bool local_1;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    for (local_18 = 0; uVar2 = std::__cxx11::string::size(), local_18 < uVar2;
        local_18 = local_18 + 1) {
      std::__cxx11::string::operator[](in_RDI);
      bVar1 = IsAlNum('\0');
      if ((!bVar1) && (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar3 != '_')) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool IsValidParamName(const std::string& name) {
    // Check for empty string
    if (name.empty())
      return false;

    // Check for invalid characters
    for (std::string::size_type index = 0; index < name.size(); ++index) {
      if (!IsAlNum(name[index]) && name[index] != '_')
        return false;
    }

    return true;
  }